

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIf.c
# Opt level: O2

Hop_Obj_t *
Abc_NodeIfToHop_rec(Hop_Man_t *pHopMan,If_Man_t *pIfMan,If_Obj_t *pIfObj,Vec_Ptr_t *vVisited)

{
  long lVar1;
  Hop_Obj_t *pHVar2;
  Hop_Obj_t *pHVar3;
  
  pHVar2 = *(Hop_Obj_t **)&pIfObj->CutBest;
  if (pHVar2 == (Hop_Obj_t *)0x0) {
    pHVar2 = Abc_NodeIfToHop_rec(pHopMan,pIfMan,pIfObj->pFanin0,vVisited);
    pHVar3 = Abc_NodeIfToHop_rec(pHopMan,pIfMan,pIfObj->pFanin1,vVisited);
    pHVar2 = Hop_And(pHopMan,(Hop_Obj_t *)((ulong)(*(uint *)pIfObj >> 4 & 1) ^ (ulong)pHVar2),
                     (Hop_Obj_t *)((ulong)(*(uint *)pIfObj >> 5 & 1) ^ (ulong)pHVar3));
    lVar1._0_4_ = (pIfObj->CutBest).Area;
    lVar1._4_4_ = (pIfObj->CutBest).Edge;
    if (lVar1 != 0) {
      __assert_fail("If_CutData(pCut) == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcIf.c"
                    ,0x232,
                    "Hop_Obj_t *Abc_NodeIfToHop_rec(Hop_Man_t *, If_Man_t *, If_Obj_t *, Vec_Ptr_t *)"
                   );
    }
    *(Hop_Obj_t **)&pIfObj->CutBest = pHVar2;
    Vec_PtrPush(vVisited,&pIfObj->CutBest);
  }
  return pHVar2;
}

Assistant:

Hop_Obj_t * Abc_NodeIfToHop_rec( Hop_Man_t * pHopMan, If_Man_t * pIfMan, If_Obj_t * pIfObj, Vec_Ptr_t * vVisited )
{
    If_Cut_t * pCut;
    Hop_Obj_t * gFunc, * gFunc0, * gFunc1;
    // get the best cut
    pCut = If_ObjCutBest(pIfObj);
    // if the cut is visited, return the result
    if ( If_CutData(pCut) )
        return (Hop_Obj_t *)If_CutData(pCut);
    // compute the functions of the children
    gFunc0 = Abc_NodeIfToHop_rec( pHopMan, pIfMan, pIfObj->pFanin0, vVisited );
    gFunc1 = Abc_NodeIfToHop_rec( pHopMan, pIfMan, pIfObj->pFanin1, vVisited );
    // get the function of the cut
    gFunc  = Hop_And( pHopMan, Hop_NotCond(gFunc0, pIfObj->fCompl0), Hop_NotCond(gFunc1, pIfObj->fCompl1) );  
    assert( If_CutData(pCut) == NULL );
    If_CutSetData( pCut, gFunc );
    // add this cut to the visited list
    Vec_PtrPush( vVisited, pCut );
    return gFunc;
}